

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

bool __thiscall wasm::WATParser::anon_unknown_10::LexCtx::canFinish(LexCtx *this)

{
  size_t sVar1;
  char *in_RCX;
  undefined1 uVar2;
  string_view in;
  string_view sv;
  string_view sv_00;
  string_view sVar3;
  _Storage<wasm::WATParser::(anonymous_namespace)::LexResult,_true> local_38;
  undefined8 local_28;
  
  uVar2 = 1;
  if ((this->input)._M_len != this->lexedSize) {
    local_38._M_value.span = (LexResult)next(this);
    local_28 = 0;
    sVar3._M_str = "(";
    sVar3._M_len = 1;
    sVar1 = startsWith((LexCtx *)&local_38._M_value,sVar3);
    if (sVar1 == 0) {
      local_38._M_value.span = (LexResult)next(this);
      local_28 = 0;
      sv._M_str = ")";
      sv._M_len = 1;
      sVar1 = startsWith((LexCtx *)&local_38._M_value,sv);
      if (sVar1 == 0) {
        sVar3 = next(this);
        in._M_len = sVar3._M_str;
        in._M_str = in_RCX;
        spacechar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)&local_38._M_value,
                  (anon_unknown_10 *)sVar3._M_len,in);
        if ((char)local_28 == '\0') {
          sv_00._M_str = ";;";
          sv_00._M_len = 2;
          sVar1 = startsWith(this,sv_00);
          uVar2 = (undefined1)sVar1;
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

bool LexCtx::canFinish() const {
  // Logically we want to check for eof, parens, and space. But we don't
  // actually want to parse more than a couple characters of space, so check for
  // individual space chars or comment starts instead.
  return empty() || lparen(next()) || rparen(next()) || spacechar(next()) ||
         startsWith(";;"sv);
}